

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9Tokenize(char *zInput,sxu32 nLen,SySet *pOut)

{
  undefined1 local_68 [4];
  sxi32 rc;
  SyLex sLexer;
  SySet *pOut_local;
  sxu32 nLen_local;
  char *zInput_local;
  
  sLexer.pTokenSet = pOut;
  zInput_local._4_4_ = SyLexInit((SyLex *)local_68,pOut,jx9TokenizeInput,(void *)0x0);
  if (zInput_local._4_4_ == 0) {
    zInput_local._4_4_ =
         SyLexTokenizeInput((SyLex *)local_68,zInput,nLen,(void *)0x0,(ProcSort)0x0,(ProcCmp)0x0);
    SyLexRelease((SyLex *)local_68);
  }
  return zInput_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9Tokenize(const char *zInput,sxu32 nLen,SySet *pOut)
{
	SyLex sLexer;
	sxi32 rc;
	/* Initialize the lexer */
	rc = SyLexInit(&sLexer, &(*pOut),jx9TokenizeInput,0);
	if( rc != SXRET_OK ){
		return rc;
	}
	/* Tokenize input */
	rc = SyLexTokenizeInput(&sLexer, zInput, nLen, 0, 0, 0);
	/* Release the lexer */
	SyLexRelease(&sLexer);
	/* Tokenization result */
	return rc;
}